

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swap_color.c
# Opt level: O1

void rgb2yuv(double (*cmrgb) [3],uchar (*cmyuv) [3])

{
  long lVar1;
  uchar uVar2;
  uchar uVar3;
  uchar uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  lVar1 = 0;
  do {
    dVar6 = (*cmrgb + lVar1 + 1)[1];
    dVar5 = dVar6 * 0.114 + (*cmrgb)[lVar1] * 0.299 + (*cmrgb)[lVar1 + 1] * 0.5870000000000001;
    dVar6 = (dVar6 - dVar5) * 0.49209932279909707;
    dVar7 = ((*cmrgb)[lVar1] - dVar5) * 0.8773181169757488;
    uVar2 = 0xff;
    uVar3 = 0xff;
    if (dVar5 <= 1.0) {
      if (dVar5 <= 0.0) {
        dVar5 = 0.0;
      }
      uVar3 = (uchar)(int)(dVar5 * 255.0 + 0.5);
    }
    if (dVar6 <= 0.436) {
      if (dVar6 <= -0.436) {
        dVar6 = -0.436;
      }
      uVar2 = (uchar)(int)(dVar6 * 292.43119266055044 + 127.99999999999999);
    }
    uVar4 = 0xff;
    if (dVar7 <= 0.615) {
      if (dVar7 <= -0.615) {
        dVar7 = -0.615;
      }
      uVar4 = (uchar)(int)(dVar7 * 207.3170731707317 + 128.0);
    }
    (*cmyuv)[lVar1] = uVar3;
    (*cmyuv)[lVar1 + 1] = uVar2;
    (*cmyuv)[lVar1 + 2] = uVar4;
    lVar1 = lVar1 + 3;
  } while (lVar1 != 0x300);
  return;
}

Assistant:

static void rgb2yuv(const double (*cmrgb)[3], unsigned char (*cmyuv)[3]) {
    const double wr = 0.299, wb = 0.114, umax = 0.436, vmax = 0.615;
    const double wg = 1 - wr - wb;

    for (int i = 0; i < 256; ++i) {
        double R = cmrgb[i][0], G = cmrgb[i][1], B = cmrgb[i][2];
        double y = wr * R + wg * G + wb * B;
        double u = (umax / (1 - wb)) * (B - y);
        double v = (vmax / (1 - wr)) * (R - y);

        y = CLAMP(y, 0, 1);
        u = CLAMP(u, -umax, umax);
        v = CLAMP(v, -vmax, vmax);

        cmyuv[i][0] = 255 * y + .5;
        cmyuv[i][1] = (255 / umax / 2) * (u + umax) + .5;
        cmyuv[i][2] = (255 / vmax / 2) * (v + vmax) + .5;
    }
}